

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flags.hpp
# Opt level: O3

void __thiscall
InstructionSet::x86::Flags::
set_from<unsigned_char,(InstructionSet::x86::Flag)2,(InstructionSet::x86::Flag)7,(InstructionSet::x86::Flag)8>
          (Flags *this,uchar value)

{
  long lVar1;
  undefined3 in_register_00000031;
  uint uVar2;
  undefined8 local_c;
  undefined4 local_4;
  
  uVar2 = CONCAT31(in_register_00000031,value);
  local_c = 0x700000002;
  local_4 = 8;
  lVar1 = 0;
  do {
    switch(*(undefined4 *)((long)&local_c + lVar1)) {
    case 0:
      this->carry_ = uVar2;
      break;
    case 1:
      this->auxiliary_carry_ = uVar2;
      break;
    case 2:
      this->sign_ = uVar2 & 0xffffff80;
      break;
    case 3:
      this->overflow_ = uVar2;
      break;
    case 4:
      this->trap_ = uVar2;
      break;
    case 5:
      this->interrupt_ = uVar2;
      break;
    case 6:
      this->direction_ = -(uint)(uVar2 != 0) | 1;
      break;
    case 7:
      this->zero_ = uVar2;
      break;
    case 8:
      this->parity_ = uVar2;
    }
    lVar1 = lVar1 + 4;
  } while (lVar1 != 0xc);
  return;
}

Assistant:

void set_from(IntT value) {
			for(const auto flag: {flags...}) {
				switch(flag) {
					default: break;
					case Flag::Zero:			zero_ = value;								break;
					case Flag::Sign:			sign_ = value & Numeric::top_bit<IntT>();	break;
					case Flag::ParityOdd:		parity_ = value;							break;
					case Flag::Carry:			carry_ = value;								break;
					case Flag::AuxiliaryCarry:	auxiliary_carry_ = value;					break;
					case Flag::Overflow:		overflow_ = value;							break;
					case Flag::Interrupt:		interrupt_ = value;							break;
					case Flag::Trap:			trap_ = value;								break;
					case Flag::Direction:		direction_ = value ? -1 : 1;				break;
				}
			}
		}